

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O0

ssize_t __thiscall
wasm::LEB<int,_signed_char>::read(LEB<int,_signed_char> *this,int __fd,void *__buf,size_t __nbytes)

{
  ParseException *pPVar1;
  undefined4 in_register_00000034;
  uint local_104;
  allocator<char> local_e9;
  string local_e8;
  long local_c8;
  size_t sext_bits;
  string local_b8;
  undefined1 local_92;
  allocator<char> local_91;
  string local_90;
  undefined1 local_6d;
  allocator<char> local_59;
  string local_58;
  uint local_34;
  uint local_30;
  int unused_bits;
  int unused_bits_mask;
  int significant_payload;
  uint payload_mask;
  int payload;
  bool last;
  char byte;
  function<signed_char_()> *pfStack_18;
  int shift;
  function<signed_char_()> *get_local;
  LEB<int,_signed_char> *this_local;
  
  this->value = 0;
  payload = 0;
  pfStack_18 = (function<signed_char_()> *)CONCAT44(in_register_00000034,__fd);
  get_local = (function<signed_char_()> *)this;
  while( true ) {
    payload_mask._3_1_ =
         std::function<signed_char_()>::operator()
                   ((function<signed_char_()> *)CONCAT44(in_register_00000034,__fd));
    payload_mask._2_1_ = (((int)(char)payload_mask._3_1_ & 0x80U) != 0 ^ 0xffU) & 1;
    significant_payload = (int)(char)payload_mask._3_1_ & 0x7f;
    if (payload == 0) {
      local_104 = 0xffffffff;
    }
    else {
      local_104 = (1 << (0x20 - (byte)payload & 0x1f)) - 1;
    }
    unused_bits_mask = local_104;
    unused_bits = local_104 & significant_payload;
    this->value = unused_bits << ((byte)payload & 0x1f) | this->value;
    local_30 = (local_104 ^ 0xffffffff) & 0x7f;
    local_34 = significant_payload & local_30;
    if (this->value < 0) {
      if (local_34 != local_30) {
        local_6d = 1;
        pPVar1 = (ParseException *)__cxa_allocate_exception(0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"Unused negative LEB bits must be 1s",&local_59);
        ParseException::ParseException(pPVar1,&local_58);
        local_6d = 0;
        __cxa_throw(pPVar1,&ParseException::typeinfo,ParseException::~ParseException);
      }
    }
    else if (local_34 != 0) {
      local_92 = 1;
      pPVar1 = (ParseException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"Unused non-negative LEB bits must be 0s",&local_91);
      ParseException::ParseException(pPVar1,&local_90);
      local_92 = 0;
      __cxa_throw(pPVar1,&ParseException::typeinfo,ParseException::~ParseException);
    }
    if (payload_mask._2_1_ != 0) break;
    payload = payload + 7;
    if (0x1f < (uint)payload) {
      sext_bits._6_1_ = 1;
      pPVar1 = (ParseException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"LEB overflow",(allocator<char> *)((long)&sext_bits + 7));
      ParseException::ParseException(pPVar1,&local_b8);
      sext_bits._6_1_ = 0;
      __cxa_throw(pPVar1,&ParseException::typeinfo,ParseException::~ParseException);
    }
    payload_mask._2_1_ = 0;
  }
  payload = payload + 7;
  if (((payload_mask._3_1_ & 0x40) != 0) && ((uint)payload < 0x20)) {
    local_c8 = 0x20 - (long)payload;
    this->value = this->value << ((byte)local_c8 & 0x1f);
    this->value = this->value >> ((byte)local_c8 & 0x1f);
    if (-1 < this->value) {
      pPVar1 = (ParseException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8," LEBsign-extend should produce a negative value",&local_e9);
      ParseException::ParseException(pPVar1,&local_e8);
      __cxa_throw(pPVar1,&ParseException::typeinfo,ParseException::~ParseException);
    }
  }
  return (ssize_t)this;
}

Assistant:

LEB<T, MiniT>& read(std::function<MiniT()> get) {
    value = 0;
    T shift = 0;
    MiniT byte;
    while (1) {
      byte = get();
      bool last = !(byte & 128);
      T payload = byte & 127;
      using mask_type = typename std::make_unsigned<T>::type;
      auto payload_mask = 0 == shift
                            ? ~mask_type(0)
                            : ((mask_type(1) << (sizeof(T) * 8 - shift)) - 1u);
      T significant_payload = payload_mask & payload;
      value |= significant_payload << shift;
      T unused_bits_mask = ~payload_mask & 127;
      T unused_bits = payload & unused_bits_mask;
      if (std::is_signed_v<T> && value < 0) {
        if (unused_bits != unused_bits_mask) {
          throw ParseException("Unused negative LEB bits must be 1s");
        }
      } else {
        if (unused_bits != 0) {
          throw ParseException("Unused non-negative LEB bits must be 0s");
        }
      }
      if (last) {
        break;
      }
      shift += 7;
      if (size_t(shift) >= sizeof(T) * 8) {
        throw ParseException("LEB overflow");
      }
    }
    // If signed LEB, then we might need to sign-extend.
    if constexpr (std::is_signed_v<T>) {
      shift += 7;
      if ((byte & 64) && size_t(shift) < 8 * sizeof(T)) {
        size_t sext_bits = 8 * sizeof(T) - size_t(shift);
        value <<= sext_bits;
        value >>= sext_bits;
        if (value >= 0) {
          throw ParseException(
            " LEBsign-extend should produce a negative value");
        }
      }
    }
    return *this;
  }